

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,char_const(&)[66],kj::ArrayPtr<unsigned_char_const>&,kj::ArrayPtr<unsigned_char_const>&,std::__cxx11::string_const&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [66],ArrayPtr<const_unsigned_char> *params_1,
          ArrayPtr<const_unsigned_char> *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_00000014;
  ArrayPtr<const_unsigned_char> *params_00;
  ArrayPtr<const_unsigned_char> *params_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_02;
  long lVar4;
  String argValues [4];
  String *pSVar5;
  undefined8 uVar6;
  String local_98;
  String local_80;
  String local_68;
  String local_50;
  
  this->exception = (Exception *)0x0;
  str<char_const(&)[66]>(&local_98,(kj *)params,(char (*) [66])CONCAT44(in_register_00000014,line));
  str<kj::ArrayPtr<unsigned_char_const>&>(&local_80,(kj *)params_1,params_00);
  str<kj::ArrayPtr<unsigned_char_const>&>(&local_68,(kj *)params_2,params_01);
  str<std::__cxx11::string_const&>(&local_50,(kj *)params_3,params_02);
  pSVar5 = &local_98;
  uVar6 = 4;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_98.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_98.content.size_ + lVar4);
      *(undefined8 *)((long)&local_98.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_98.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_98.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,pSVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}